

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_handler.hpp
# Opt level: O3

void get_files(string *source_dir,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *image_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  directory_iterator __begin1;
  string img_p;
  directory_iterator local_90;
  directory_iterator local_80;
  path local_70;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_70,source_dir);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_80,&local_70,none,(error_code *)0x0);
  CLI::std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  if (local_80._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_90._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_80._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_90._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_80._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_90._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_80._M_dir.
                super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_90._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_80._M_dir.
           super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_80._M_dir.
          super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_0010b072;
    }
    else {
      (local_80._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_80._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
    local_90._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_80._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_90._M_dir.
    super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_80._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_80._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_80._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
LAB_0010b072:
  paVar1 = &local_70._M_pathname.field_2;
  do {
    if (local_90._M_dir.
        super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_80._M_dir.
          super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80._M_dir.
                   super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      __first._M_current =
           (image_path->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (image_path->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        uVar4 = (long)__last._M_current - (long)__first._M_current >> 5;
        lVar3 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string,std::__cxx11::string)>>
                  (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    )0x10afac);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string,std::__cxx11::string)>>
                  (__first,__last,
                   (_Iter_comp_iter<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    )0x10afac);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      return;
    }
    plVar2 = (long *)std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                               (&local_90);
    local_70._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,*plVar2,plVar2[1] + *plVar2);
    lVar3 = std::__cxx11::string::find((char *)&local_70,0x1440ea,0);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)&local_70,0x1440ef,0);
      if (lVar3 != -1) goto LAB_0010b106;
      lVar3 = std::__cxx11::string::find((char *)&local_70,0x1440f5,0);
      if (lVar3 != -1) goto LAB_0010b106;
    }
    else {
LAB_0010b106:
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(image_path,&local_70._M_pathname);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_pathname._M_dataplus._M_p,
                      local_70._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_90);
  } while( true );
}

Assistant:

void get_files(string source_dir, vector<string> &image_path)
{

    
    for (const auto &entry : experimental::filesystem::directory_iterator(source_dir))
    {
        string img_p = entry.path();
        if ((img_p.find(".jpg") != std::string::npos) or (img_p.find(".jpeg") != std::string::npos) or (img_p.find(".png") != std::string::npos))
        {
            image_path.push_back(img_p);
        }
    }
    sort(image_path.begin(), image_path.end(), comp);
    cout << "done"<<endl;
}